

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ust.hpp
# Opt level: O2

StackTrace * ust::generate(void)

{
  string *__k;
  key_type *__k_00;
  void *pvVar1;
  pointer pSVar2;
  __type_conflict _Var3;
  bool bVar4;
  int iVar5;
  istream *piVar6;
  unsigned_long_long uVar7;
  unsigned_long_long uVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  void *__ptr;
  char *pcVar11;
  iterator iVar12;
  mapped_type *pmVar13;
  ostream *poVar14;
  _Rb_tree_node_base *p_Var15;
  ulong uVar16;
  long lVar17;
  uint64_t address;
  uint64_t address_00;
  char *cmd;
  string *this;
  uint uVar18;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar19;
  StackTrace *in_RDI;
  _Rb_tree_node_base *p_Var20;
  StackTraceEntry *it;
  pointer pSVar21;
  allocator<char> local_1639;
  string inode;
  string path;
  string device;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  fileData;
  int status;
  undefined4 uStack_1594;
  vector<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_> stackTrace;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  addressMaps;
  string line;
  string procMapFileName;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  fileAddresses;
  void *stack [64];
  ifstream infile;
  regex addrToLineRegex;
  
  std::mutex::lock(&generate::mtx);
  stackTrace.super__Vector_base<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  addressMaps._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &addressMaps._M_t._M_impl.super__Rb_tree_header._M_header;
  addressMaps._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  addressMaps._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  addressMaps._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  stackTrace.super__Vector_base<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  stackTrace.super__Vector_base<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  addressMaps._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       addressMaps._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&procMapFileName,"/proc/self/maps",(allocator<char> *)&addrToLineRegex);
  std::ifstream::ifstream(&infile,procMapFileName._M_dataplus._M_p,_S_in);
  do {
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&infile,(string *)&line);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&addrToLineRegex,(string *)&line,_S_in);
    stack[0] = stack + 2;
    stack[1] = (void *)0x0;
    stack[2]._0_1_ = 0;
    fileAddresses._M_t._M_impl._0_8_ =
         &fileAddresses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    fileAddresses._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fileAddresses._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    fileAddresses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         ((ulong)fileAddresses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
         0xffffffffffffff00);
    fileData._M_t._M_impl._0_8_ = &fileData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    fileData._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fileData._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    device._M_dataplus._M_p = (pointer)&device.field_2;
    device._M_string_length = 0;
    inode._M_dataplus._M_p = (pointer)&inode.field_2;
    inode._M_string_length = 0;
    fileData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         ((ulong)fileData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
         0xffffffffffffff00);
    device.field_2._M_local_buf[0] = '\0';
    inode.field_2._M_allocated_capacity = inode.field_2._M_allocated_capacity & 0xffffffffffffff00;
    path._M_string_length = 0;
    path.field_2._M_local_buf[0] = '\0';
    path._M_dataplus._M_p = (pointer)&path.field_2;
    piVar6 = std::operator>>((istream *)&addrToLineRegex,(string *)stack);
    piVar6 = std::operator>>(piVar6,(string *)&fileAddresses);
    piVar6 = std::operator>>(piVar6,(string *)&fileData);
    piVar6 = std::operator>>(piVar6,(string *)&device);
    piVar6 = std::operator>>(piVar6,(string *)&inode);
    piVar6 = std::operator>>(piVar6,(string *)&path);
    uVar18 = *(uint *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18) + 0x20);
    if ((uVar18 & 5) == 0) {
      split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&status,(string *)stack,'-');
      uVar7 = std::__cxx11::stoull((string *)CONCAT44(uStack_1594,status),(size_t *)0x0,0x10);
      Catch::clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&status);
      split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&status,(string *)stack,'-');
      uVar8 = std::__cxx11::stoull
                        ((string *)(CONCAT44(uStack_1594,status) + 0x20),(size_t *)0x0,0x10);
      Catch::clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&status);
      iVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
              ::find(&addressMaps._M_t,&path);
      if ((_Rb_tree_header *)iVar9._M_node == &addressMaps._M_t._M_impl.super__Rb_tree_header) {
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                                *)&addressMaps._M_t,&path);
        pmVar10->first = uVar7;
      }
      else {
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                                *)&addressMaps._M_t,&path);
        uVar16 = pmVar10->first;
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                                *)&addressMaps._M_t,&path);
        if (uVar7 < uVar16) {
          uVar16 = uVar7;
        }
        pmVar10->first = uVar16;
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                                *)&addressMaps._M_t,&path);
        uVar16 = pmVar10->second;
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                                *)&addressMaps._M_t,&path);
        if (uVar8 < uVar16) {
          uVar8 = uVar16;
        }
      }
      pmVar10->second = uVar8;
    }
    std::__cxx11::string::~string((string *)&path);
    std::__cxx11::string::~string((string *)&inode);
    std::__cxx11::string::~string((string *)&device);
    std::__cxx11::string::~string((string *)&fileData);
    std::__cxx11::string::~string((string *)&fileAddresses);
    std::__cxx11::string::~string((string *)stack);
    std::__cxx11::istringstream::~istringstream((istringstream *)&addrToLineRegex);
  } while ((uVar18 & 5) == 0);
  iVar5 = backtrace(stack,0x40);
  uVar18 = iVar5 - 1;
  memmove(stack,stack + 1,(long)iVar5 * 8 - 8);
  __ptr = (void *)backtrace_symbols(stack,uVar18);
  if (__ptr != (void *)0x0) {
    if ((int)uVar18 < 1) {
      uVar18 = 0;
    }
    for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
      fileData._M_t._M_impl._0_8_ = &fileData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
      ;
      fileData._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fileData._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      device._M_dataplus._M_p = (pointer)&device.field_2;
      device._M_string_length = 0;
      inode._M_dataplus._M_p = (pointer)&inode.field_2;
      inode._M_string_length = 0;
      fileData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           ((ulong)fileData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
           0xffffffffffffff00);
      device.field_2._M_local_buf[0] = '\0';
      inode.field_2._M_allocated_capacity = inode.field_2._M_allocated_capacity & 0xffffffffffffff00
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&path,*(char **)((long)__ptr + uVar16 * 8),
                 (allocator<char> *)&addrToLineRegex);
      std::__cxx11::string::find((char *)&path,0x1b6bb4);
      std::__cxx11::string::find((char *)&path,0x1b56da);
      std::__cxx11::string::substr((ulong)&addrToLineRegex,(ulong)&path);
      std::__cxx11::string::operator=((string *)&device,(string *)&addrToLineRegex);
      std::__cxx11::string::~string((string *)&addrToLineRegex);
      pcVar11 = realpath(device._M_dataplus._M_p,(char *)&addrToLineRegex);
      if (pcVar11 != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fileAddresses,(char *)&addrToLineRegex,(allocator<char> *)&status);
        std::__cxx11::string::operator=((string *)&device,(string *)&fileAddresses);
        std::__cxx11::string::~string((string *)&fileAddresses);
      }
      std::__cxx11::string::substr((ulong)&fileAddresses,(ulong)&path);
      std::__cxx11::string::operator=((string *)&inode,(string *)&fileAddresses);
      std::__cxx11::string::~string((string *)&fileAddresses);
      std::__cxx11::string::find((char *)&inode,0x1baaa2);
      std::__cxx11::string::substr((ulong)&fileAddresses,(ulong)&inode);
      std::__cxx11::string::operator=((string *)&inode,(string *)&fileAddresses);
      std::__cxx11::string::~string((string *)&fileAddresses);
      iVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
              ::find(&addressMaps._M_t,&device);
      if ((_Rb_tree_header *)iVar9._M_node == &addressMaps._M_t._M_impl.super__Rb_tree_header) {
        addressToString_abi_cxx11_((string *)&fileAddresses,(ust *)stack[uVar16],address);
        std::__cxx11::string::operator=((string *)&fileData,(string *)&fileAddresses);
        std::__cxx11::string::~string((string *)&fileAddresses);
      }
      else {
        pvVar1 = stack[uVar16];
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                  ::operator[](&addressMaps,&device);
        addressToString_abi_cxx11_
                  ((string *)&fileAddresses,(ust *)((long)pvVar1 - pmVar10->first),address_00);
        std::__cxx11::string::operator=((string *)&fileData,(string *)&fileAddresses);
        std::__cxx11::string::~string((string *)&fileAddresses);
      }
      if (inode._M_string_length != 0) {
        status = 0;
        pcVar11 = (char *)__cxa_demangle(inode._M_dataplus._M_p,0,0,&status);
        if (status == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&fileAddresses,pcVar11,&local_1639);
          std::__cxx11::string::operator=((string *)&inode,(string *)&fileAddresses);
          std::__cxx11::string::~string((string *)&fileAddresses);
        }
        free(pcVar11);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&status,"",&local_1639);
      StackTraceEntry::StackTraceEntry
                ((StackTraceEntry *)&fileAddresses,(int)uVar16,(string *)&fileData,&device,&inode,
                 (string *)&status,-1);
      std::__cxx11::string::~string((string *)&status);
      std::vector<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_>::push_back
                (&stackTrace,(StackTraceEntry *)&fileAddresses);
      StackTraceEntry::~StackTraceEntry((StackTraceEntry *)&fileAddresses);
      std::__cxx11::string::~string((string *)&path);
      std::__cxx11::string::~string((string *)&inode);
      std::__cxx11::string::~string((string *)&device);
      std::__cxx11::string::~string((string *)&fileData);
    }
    free(__ptr);
  }
  pSVar2 = stackTrace.
           super__Vector_base<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  fileAddresses._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fileAddresses._M_t._M_impl.super__Rb_tree_header._M_header;
  fileAddresses._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       fileAddresses._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  fileAddresses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fileAddresses._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fileData._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fileData._M_t._M_impl.super__Rb_tree_header._M_header;
  fileData._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       fileData._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  fileData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fileData._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fileData._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fileData._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  fileAddresses._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fileAddresses._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pSVar21 = stackTrace.
                 super__Vector_base<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_>.
                 _M_impl.super__Vector_impl_data._M_start; pSVar21 != pSVar2; pSVar21 = pSVar21 + 1)
  {
    if ((pSVar21->binaryFileName)._M_string_length != 0) {
      __k = &pSVar21->binaryFileName;
      iVar12 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::find(&fileAddresses._M_t,__k);
      if ((_Rb_tree_header *)iVar12._M_node == &fileAddresses._M_t._M_impl.super__Rb_tree_header) {
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                *)&fileAddresses._M_t,__k);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(pmVar13,(initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )ZEXT816(0));
      }
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      *)&fileAddresses._M_t,__k);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pmVar13,&pSVar21->address);
    }
  }
  for (p_Var15 = (_Rb_tree_node_base *)
                 fileAddresses._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var15 != &fileAddresses._M_t._M_impl.super__Rb_tree_header;
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
    std::__cxx11::string::string((string *)&device,(string *)(p_Var15 + 1));
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&addrToLineRegex);
    poVar14 = std::operator<<((ostream *)&addrToLineRegex,"addr2line -C -f -p -e ");
    poVar14 = std::operator<<(poVar14,(string *)&device);
    std::operator<<(poVar14," ");
    p_Var20 = p_Var15 + 2;
    while (p_Var20 = *(_Rb_tree_node_base **)p_Var20, p_Var20 != p_Var15 + 2) {
      poVar14 = std::operator<<((ostream *)&addrToLineRegex,(string *)&p_Var20->_M_left);
      std::operator<<(poVar14," ");
    }
    std::__cxx11::stringbuf::str();
    SystemToStr_abi_cxx11_(&inode,(ust *)path._M_dataplus._M_p,cmd);
    std::__cxx11::string::~string((string *)&path);
    if (inode._M_string_length != 0) {
      split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&path,&inode,'\n');
      std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      list<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&status,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )path._M_dataplus._M_p,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )path._M_string_length,(allocator_type *)&local_1639);
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::operator[](&fileData,&device);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(pmVar13,(_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&status);
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&status);
      Catch::clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&path);
    }
    std::__cxx11::string::~string((string *)&inode);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&addrToLineRegex);
    std::__cxx11::string::~string((string *)&device);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&addrToLineRegex,"^(.+?) at (.+):([0-9]+)",0x10);
  pSVar2 = stackTrace.
           super__Vector_base<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this = (string *)
              &(stackTrace.
                super__Vector_base<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_>.
                _M_impl.super__Vector_impl_data._M_start)->functionName;
      (pointer)(this + -0x48) != pSVar2; this = this + 0x90) {
    if (*(long *)(this + -0x18) != 0) {
      __k_00 = (key_type *)(this + -0x20);
      iVar12 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::find(&fileData._M_t,__k_00);
      if ((_Rb_tree_header *)iVar12._M_node != &fileData._M_t._M_impl.super__Rb_tree_header) {
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        *)&fileData._M_t,__k_00);
        std::__cxx11::string::string
                  ((string *)&device,
                   (string *)
                   ((pmVar13->
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl._M_node.super__List_node_base._M_next + 1));
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        *)&fileData._M_t,__k_00);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_front(pmVar13);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&inode,"?? ??:0",(allocator<char> *)&path);
        _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&device,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&inode);
        std::__cxx11::string::~string((string *)&inode);
        if (!_Var3) {
          inode.field_2._M_allocated_capacity = 0;
          inode.field_2._8_8_ = 0;
          inode._M_dataplus._M_p = (pointer)0x0;
          inode._M_string_length = 0;
          bVar4 = std::
                  regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &device,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      *)&inode,&addrToLineRegex,0);
          if (bVar4) {
            lVar17 = inode._M_string_length - (long)inode._M_dataplus._M_p;
            if ((lVar17 == 0) || (0xfffffffffffffffd < lVar17 / 0x18 - 5U)) {
              psVar19 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(inode._M_dataplus._M_p + lVar17 + -0x48);
            }
            else {
              psVar19 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(inode._M_dataplus._M_p + 0x18);
            }
            std::__cxx11::
            sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::str(&path,psVar19);
            std::__cxx11::string::operator=(this,(string *)&path);
            std::__cxx11::string::~string((string *)&path);
            lVar17 = inode._M_string_length - (long)inode._M_dataplus._M_p;
            if ((lVar17 == 0) || (0xfffffffffffffffc < lVar17 / 0x18 - 6U)) {
              psVar19 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(inode._M_dataplus._M_p + lVar17 + -0x48);
            }
            else {
              psVar19 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(inode._M_dataplus._M_p + 0x30);
            }
            std::__cxx11::
            sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::str(&path,psVar19);
            std::__cxx11::string::operator=(this + 0x20,(string *)&path);
            std::__cxx11::string::~string((string *)&path);
            lVar17 = inode._M_string_length - (long)inode._M_dataplus._M_p;
            if ((lVar17 == 0) || (0xfffffffffffffffb < lVar17 / 0x18 - 7U)) {
              psVar19 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(inode._M_dataplus._M_p + lVar17 + -0x48);
            }
            else {
              psVar19 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(inode._M_dataplus._M_p + 0x48);
            }
            std::__cxx11::
            sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::str(&path,psVar19);
            iVar5 = std::__cxx11::stoi(&path,(size_t *)0x0,10);
            *(int *)(this + 0x40) = iVar5;
            std::__cxx11::string::~string((string *)&path);
          }
          Catch::clara::std::
          _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&inode);
        }
        std::__cxx11::string::~string((string *)&device);
      }
    }
  }
  std::vector<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_>::vector
            (&in_RDI->entries,&stackTrace);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&addrToLineRegex);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&fileData._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&fileAddresses._M_t);
  std::ifstream::~ifstream(&infile);
  std::__cxx11::string::~string((string *)&procMapFileName);
  std::__cxx11::string::~string((string *)&line);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  ::~_Rb_tree(&addressMaps._M_t);
  std::vector<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_>::~vector(&stackTrace);
  pthread_mutex_unlock((pthread_mutex_t *)&generate::mtx);
  return in_RDI;
}

Assistant:

inline StackTrace generate() {
  // Libunwind and some other functions aren't thread safe.
  static std::mutex mtx;
  std::lock_guard<std::mutex> lock(mtx);

  std::vector<StackTraceEntry> stackTrace;
  std::map<std::string, std::pair<uint64_t, uint64_t> > addressMaps;
  std::string line;
  std::string procMapFileName = std::string("/proc/self/maps");
  std::ifstream infile(procMapFileName.c_str());
  // Some OSes don't have /proc/*/maps, so we won't have base addresses for them
  while (std::getline(infile, line)) {
    std::istringstream iss(line);
    std::string addressRange;
    std::string perms;
    std::string offset;
    std::string device;
    std::string inode;
    std::string path;

    if (!(iss >> addressRange >> perms >> offset >> device >> inode >> path)) {
      break;
    }  // error
    uint64_t startAddress = stoull(split(addressRange, '-')[0], NULL, 16);
    uint64_t endAddress = stoull(split(addressRange, '-')[1], NULL, 16);
    if (addressMaps.find(path) == addressMaps.end()) {
      addressMaps[path] = std::make_pair(startAddress, endAddress);
    } else {
      addressMaps[path].first = std::min(addressMaps[path].first, startAddress);
      addressMaps[path].second = std::max(addressMaps[path].second, endAddress);
    }
  }

#if !USE_UNWIND
  void *stack[MAX_STACK_FRAMES];
  int numFrames;
#endif
#if defined(__MINGW32__) || defined(__MINGW64__)
  numFrames = CaptureStackBackTrace(1, MAX_STACK_FRAMES, stack, NULL);

  for (unsigned short a = 0; a < numFrames; a++) {
    HMODULE moduleHandle;
    GetModuleHandleExA(GET_MODULE_HANDLE_EX_FLAG_FROM_ADDRESS,
                       (const char *)stack[a], &moduleHandle);
    std::string fileName(4096, '\0');
    auto fileNameSize =
        GetModuleFileNameA(moduleHandle, &fileName[0], fileName.size());
    if (fileNameSize == 0 || fileNameSize == (ssize_t)fileName.size()) {
      /* Error, possibly not enough space. */
      fileName = "";
    } else {
      fileName = fileName.substr(0, fileNameSize);
      std::replace(fileName.begin(), fileName.end(), '\\', '/');
    }
    std::string addr = addressToString(uint64_t(stack[a]));
    StackTraceEntry entry(a, addr, fileName, "", "", -1);
    stackTrace.push_back(entry);
  }
#elif USE_UNWIND
  unw_context_t context;
  unw_getcontext(&context);

  unw_cursor_t cursor;
  unw_init_local(&cursor, &context);

  unw_word_t ip;

  for (int a = 0; unw_step(&cursor) > 0; a++) {
    unw_get_reg(&cursor, UNW_REG_IP, &ip);
    static const size_t kMax = 16 * 1024;
    char mangled[kMax];
    unw_word_t offset;
    unw_get_proc_name(&cursor, mangled, kMax, &offset);

    int ok;
    char *demangled = abi::__cxa_demangle(mangled, 0, 0, &ok);

    std::string filename;
    uint64_t absoluteAddress = uint64_t(ip);
    uint64_t relativeAddress = 0;
    for (auto &it : addressMaps) {
      if (it.second.first <= absoluteAddress &&
          it.second.second > absoluteAddress) {
        filename = it.first;
        relativeAddress = absoluteAddress - it.second.first;
      }
    }

    StackTraceEntry entry(
        a,
        relativeAddress ? addressToString(relativeAddress)
                        : addressToString(absoluteAddress),
        filename, ok == 0 ? std::string(demangled) : std::string(mangled), "",
        -1);
    if (demangled) {
      free(demangled);
    }
    stackTrace.push_back(entry);
  }
#else
  numFrames = backtrace(stack, MAX_STACK_FRAMES);
  memmove(stack, stack + 1, sizeof(void *) * (numFrames - 1));
  numFrames--;

  char **strings = backtrace_symbols(stack, numFrames);
  if (strings) {
    for (int a = 0; a < numFrames; ++a) {
      std::string addr;
      std::string fileName;
      std::string functionName;

      const std::string line(strings[a]);
#ifdef __APPLE__
      // Example: ust-test                            0x000000010001e883
      // _ZNK5Catch21TestInvokerAsFunction6invokeEv + 19
      auto p = line.find("0x");
      if (p != std::string::npos) {
        addr = line.substr(p);
        auto spaceLoc = addr.find(" ");
        functionName = addr.substr(spaceLoc + 1);
        functionName = functionName.substr(0, functionName.find(" +"));
        addr = addr.substr(0, spaceLoc);
      }
#else
      // Example: ./ust-test(_ZNK5Catch21TestInvokerAsFunction6invokeEv+0x16)
      // [0x55f1278af96e]
      auto parenStart = line.find("(");
      auto parenEnd = line.find(")");
      fileName = line.substr(0, parenStart);
      // Convert filename to canonical path
      char buf[PATH_MAX];
      char *res = ::realpath(fileName.c_str(), buf);
      if (res)  // if realpath failed, use filename
        fileName = std::string(buf);
      functionName = line.substr(parenStart + 1, parenEnd - (parenStart + 1));
      // Strip off the offset from the name
      functionName = functionName.substr(0, functionName.find("+"));
      if (addressMaps.find(fileName) != addressMaps.end()) {
        // Make address relative to process start
        addr =
            addressToString(uint64_t(stack[a]) - addressMaps[fileName].first);
      } else {
        addr = addressToString(uint64_t(stack[a]));
      }
#endif
      // Perform demangling if parsed properly
      if (!functionName.empty()) {
        int status = 0;
        auto demangledFunctionName =
            abi::__cxa_demangle(functionName.data(), 0, 0, &status);
        // if demangling is successful, output the demangled function name
        if (status == 0) {
          // Success (see
          // http://gcc.gnu.org/onlinedocs/libstdc++/libstdc++-html-USERS-4.3/a01696.html)
          functionName = std::string(demangledFunctionName);
        }
        if (demangledFunctionName) {
          free(demangledFunctionName);
        }
      }
      StackTraceEntry entry(a, addr, fileName, functionName, "", -1);
      stackTrace.push_back(entry);
    }
    free(strings);
  }
#endif

// Fetch source file & line numbers
#ifdef __APPLE__
  std::ostringstream ss;
  ss << "atos -p " << std::to_string(getpid()) << " ";
  for (int a = 0; a < (int)stackTrace.size(); a++) {
    ss << stackTrace[a].address << " ";
  }
  auto atosOutput = SystemToStr(ss.str().c_str());
  if (atosOutput.length()) {
    auto atosLines = split(atosOutput, '\n');
    std::regex fileLineRegex("\\(([^\\(]+):([0-9]+)\\)");
    for (int a = 0; a < (int)stackTrace.size(); a++) {
      // Find the filename and line number
      std::smatch matches;
      if (regex_search(atosLines[a], matches, fileLineRegex)) {
        stackTrace[a].sourceFileName = matches[1];
        stackTrace[a].lineNumber = std::stoi(matches[2]);
      }
    }
  }
#else
  // Unix & MinGW
  std::map<std::string, std::list<std::string> > fileAddresses;
  std::map<std::string, std::list<std::string> > fileData;
  for (const auto &it : stackTrace) {
    if (it.binaryFileName.length()) {
      if (fileAddresses.find(it.binaryFileName) == fileAddresses.end()) {
        fileAddresses[it.binaryFileName] = {};
      }
      fileAddresses.at(it.binaryFileName).push_back(it.address);
    }
  }
  for (const auto &it : fileAddresses) {
    std::string fileName = it.first;
    std::ostringstream ss;
    ss << "addr2line -C -f -p -e " << fileName << " ";
    for (const auto &it2 : it.second) {
      ss << it2 << " ";
    }
    auto addrLineOutput = SystemToStr(ss.str().c_str());
    if (addrLineOutput.length()) {
      auto outputLines = split(addrLineOutput, '\n');
      fileData[fileName] =
          std::list<std::string>(outputLines.begin(), outputLines.end());
    }
  }
  std::regex addrToLineRegex("^(.+?) at (.+):([0-9]+)");
  for (auto &it : stackTrace) {
    if (it.binaryFileName.length() &&
        fileData.find(it.binaryFileName) != fileData.end()) {
      std::string outputLine = fileData.at(it.binaryFileName).front();
      fileData.at(it.binaryFileName).pop_front();
      if (outputLine == std::string("?? ??:0")) {
        continue;
      }
      std::smatch matches;
      if (regex_search(outputLine, matches, addrToLineRegex)) {
        it.functionName = matches[1];
        it.sourceFileName = matches[2];
        it.lineNumber = std::stoi(matches[3]);
      }
    }
  }
#endif

  return StackTrace(stackTrace);
#endif
}